

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O2

idx_t duckdb::SelectNotNull
                (Vector *left,Vector *right,idx_t count,SelectionVector *sel,
                SelectionVector *maybe_vec,OptionalSelection *false_opt,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  sel_t *psVar1;
  sel_t *psVar2;
  ulong uVar3;
  TemplatedValidityMask<unsigned_long> *this;
  ulong uVar4;
  idx_t iVar5;
  ulong count_00;
  sel_t sVar6;
  idx_t i;
  ulong uVar7;
  ulong row_idx;
  SelectionVector slicer;
  UnifiedVectorFormat rvdata;
  UnifiedVectorFormat lvdata;
  optional_ptr<duckdb::ValidityMask,_true> local_f0;
  Vector *local_e8;
  Vector *local_e0;
  SelectionVector local_d8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  local_f0 = (optional_ptr<duckdb::ValidityMask,_true>)
             (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,count,&local_78);
  Vector::ToUnifiedFormat(right,count,&local_c0);
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 &&
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    psVar1 = sel->sel_vector;
    psVar2 = maybe_vec->sel_vector;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      sVar6 = (sel_t)iVar5;
      if (psVar1 != (sel_t *)0x0) {
        sVar6 = psVar1[iVar5];
      }
      psVar2[iVar5] = sVar6;
    }
  }
  else {
    local_e8 = right;
    local_e0 = left;
    SelectionVector::SelectionVector(&local_d8,count);
    iVar5 = 0;
    count_00 = 0;
    for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
      row_idx = uVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        row_idx = (ulong)sel->sel_vector[uVar7];
      }
      uVar3 = uVar7;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(local_78.sel)->sel_vector[uVar7];
      }
      uVar4 = uVar7;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_c0.sel)->sel_vector[uVar7];
      }
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6]
            >> (uVar3 & 0x3f) & 1) != 0)) &&
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6]
            >> (uVar4 & 0x3f) & 1) != 0)))) {
        local_d8.sel_vector[count_00] = (sel_t)uVar7;
        maybe_vec->sel_vector[count_00] = (sel_t)row_idx;
        count_00 = count_00 + 1;
      }
      else {
        if (local_f0.ptr != (ValidityMask *)0x0) {
          this = &optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_f0)->
                  super_TemplatedValidityMask<unsigned_long>;
          TemplatedValidityMask<unsigned_long>::SetInvalid(this,row_idx);
        }
        if (false_opt->sel != (SelectionVector *)0x0) {
          false_opt->sel->sel_vector[iVar5] = (sel_t)row_idx;
        }
        iVar5 = iVar5 + 1;
      }
    }
    OptionalSelection::Advance(false_opt,iVar5);
    if (count_00 < count && count_00 != 0) {
      Vector::Slice(local_e0,&local_d8,count_00);
      Vector::Slice(local_e8,&local_d8,count_00);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_d8.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    count = count_00;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return count;
}

Assistant:

static inline idx_t SelectNotNull(Vector &left, Vector &right, const idx_t count, const SelectionVector &sel,
                                  SelectionVector &maybe_vec, OptionalSelection &false_opt,
                                  optional_ptr<ValidityMask> null_mask) {

	UnifiedVectorFormat lvdata, rvdata;
	left.ToUnifiedFormat(count, lvdata);
	right.ToUnifiedFormat(count, rvdata);

	auto &lmask = lvdata.validity;
	auto &rmask = rvdata.validity;

	// For top-level comparisons, NULL semantics are in effect,
	// so filter out any NULLs
	idx_t remaining = 0;
	if (lmask.AllValid() && rmask.AllValid()) {
		//	None are NULL, distinguish values.
		for (idx_t i = 0; i < count; ++i) {
			const auto idx = sel.get_index(i);
			maybe_vec.set_index(remaining++, idx);
		}
		return remaining;
	}

	// Slice the Vectors down to the rows that are not determined (i.e., neither is NULL)
	SelectionVector slicer(count);
	idx_t false_count = 0;
	for (idx_t i = 0; i < count; ++i) {
		const auto result_idx = sel.get_index(i);
		const auto lidx = lvdata.sel->get_index(i);
		const auto ridx = rvdata.sel->get_index(i);
		if (!lmask.RowIsValid(lidx) || !rmask.RowIsValid(ridx)) {
			if (null_mask) {
				null_mask->SetInvalid(result_idx);
			}
			false_opt.Append(false_count, result_idx);
		} else {
			//	Neither is NULL, distinguish values.
			slicer.set_index(remaining, i);
			maybe_vec.set_index(remaining++, result_idx);
		}
	}
	false_opt.Advance(false_count);

	if (remaining && remaining < count) {
		left.Slice(slicer, remaining);
		right.Slice(slicer, remaining);
	}

	return remaining;
}